

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typename.cc
# Opt level: O2

string * Typelib::getNamespace(string *__return_storage_ptr__,string *name)

{
  _List_node_base *p_Var1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  splitTypename((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_60,name);
  if (local_60._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_60) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"/",(allocator *)&local_48);
  }
  else {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    p_Var1 = (_List_node_base *)&local_60;
    while (p_Var1 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var1 != (_List_node_base *)&local_60) {
      std::operator+(&local_48,"/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var1 + 1));
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string getNamespace(const std::string& name)
    {
        list<string> split = splitTypename(name);
        if (split.empty())
            return "/";
        split.pop_back();

        std::string result;
        for (list<string>::const_iterator it = split.begin(); it != split.end(); ++it)
            result += "/" + *it;

        result += "/";
        return result;
    }